

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

BaseType __thiscall
spirv_cross::CompilerHLSL::get_builtin_basetype
          (CompilerHLSL *this,BuiltIn builtin,BaseType default_type)

{
  if (builtin == BuiltInSampleMask) {
    return default_type;
  }
  if ((((BuiltInSampleMask < builtin) || ((0x100680U >> (builtin & BuiltInGlobalSize) & 1) == 0)) &&
      (builtin != BuiltInPrimitiveShadingRateKHR)) &&
     ((builtin != BuiltInShadingRateKHR && (builtin != BuiltInFragStencilRefEXT)))) {
    return default_type;
  }
  return Int;
}

Assistant:

SPIRType::BaseType CompilerHLSL::get_builtin_basetype(BuiltIn builtin, SPIRType::BaseType default_type)
{
	switch (builtin)
	{
	case BuiltInSampleMask:
		// We declare sample mask array with module type, so always use default_type here.
		return default_type;
	default:
		return CompilerGLSL::get_builtin_basetype(builtin, default_type);
	}
}